

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::output_example(vw *all,cb_explore_adf *c,multi_ex *ec_seq)

{
  polyprediction *a_s;
  int iVar1;
  action_score *paVar2;
  pointer ppeVar3;
  int *piVar4;
  wclass *pwVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  ostream *poVar9;
  pointer ppeVar10;
  ulong uVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  example *ec;
  size_t num_features;
  int *piVar14;
  float *pfVar15;
  long lVar16;
  float loss;
  float fVar17;
  string outputString;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  example *peVar18;
  vw *all_00;
  float fVar19;
  undefined4 uVar20;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  ppeVar10 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar10) {
    ec = *ppeVar10;
    a_s = &ec->pred;
    paVar2 = (ec->pred).a_s._begin;
    pfVar15 = (ec->pred).scalars._end;
    num_features = 0;
    uVar12 = 0;
    do {
      bVar8 = CB::ec_is_example_header(ppeVar10[uVar12]);
      uVar20 = (undefined4)((ulong)c >> 0x20);
      ppeVar10 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if (!bVar8) {
        num_features = num_features + ppeVar10[uVar12]->num_features;
      }
      uVar12 = uVar12 + 1;
      ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar11 = (long)ppeVar3 - (long)ppeVar10 >> 3;
    } while (uVar12 < uVar11);
    fVar19 = (c->gen_cs).known_cost.probability;
    loss = 0.0;
    bVar8 = 0.0 < fVar19;
    if ((0.0 < fVar19) && (lVar16 = (long)pfVar15 - (long)paVar2, lVar16 != 0)) {
      uVar12 = 0;
      do {
        fVar17 = (c->gen_cs).known_cost.cost / fVar19;
        if ((c->gen_cs).known_cost.action != paVar2[uVar12].action) {
          fVar17 = 0.0;
        }
        loss = loss + fVar17 * paVar2[uVar12].score;
        uVar12 = uVar12 + 1;
      } while ((uVar12 & 0xffffffff) < (ulong)(lVar16 >> 3));
    }
    if (ppeVar3 != ppeVar10) {
      uVar12 = 0;
      do {
        bVar8 = (bool)(bVar8 & ppeVar10[uVar12]->test_only);
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    peVar18 = ec;
    all_00 = all;
    shared_data::update(all->sd,bVar8,0.0 < fVar19,loss,ec->weight,num_features);
    piVar14 = (all->final_prediction_sink)._begin;
    piVar4 = (all->final_prediction_sink)._end;
    if (piVar14 != piVar4) {
      do {
        ACTION_SCORE::print_action_score
                  (*piVar14,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,&ec->tag);
        piVar14 = piVar14 + 1;
      } while (piVar14 != piVar4);
    }
    if (0 < all_00->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      pwVar5 = (ec->l).cs.costs._begin;
      lVar16 = (long)(ec->l).cs.costs._end - (long)pwVar5;
      if (lVar16 != 0) {
        lVar16 = lVar16 >> 4;
        pfVar15 = &pwVar5->wap_value;
        lVar13 = 0;
        do {
          if (lVar13 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdef,1);
          }
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdef = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffdef,1);
          std::ostream::_M_insert<double>((double)*pfVar15);
          lVar13 = lVar13 + 1;
          pfVar15 = pfVar15 + 4;
        } while (lVar16 + (ulong)(lVar16 == 0) != lVar13);
      }
      p_Var6 = all_00->print_text;
      iVar1 = all_00->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar7._begin._7_1_ = in_stack_fffffffffffffdef;
      vVar7._begin._0_7_ = in_stack_fffffffffffffde8;
      vVar7._end = (char *)peVar18;
      vVar7.end_array = (char *)all_00;
      vVar7.erase_count._0_4_ = fVar19;
      vVar7.erase_count._4_4_ = uVar20;
      (*p_Var6)(iVar1,(string)peVar18->tag,vVar7);
      ec = peVar18;
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
        ec = peVar18;
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    CB::print_update(all_00,fVar19 <= 0.0,ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_explore_adf& c, multi_ex& ec_seq)
{
  if (ec_seq.size() <= 0)
    return;

  size_t num_features = 0;

  float loss = 0.;

  auto& ec = *ec_seq[0];
  ACTION_SCORE::action_scores preds = ec.pred.a_s;

  for (size_t i = 0; i < ec_seq.size(); i++)
    if (!CB::ec_is_example_header(*ec_seq[i]))
      num_features += ec_seq[i]->num_features;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.gen_cs.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq.size(); i++) holdout_example &= ec_seq[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, &ec_seq, true);
}